

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_visuals.cxx
# Opt level: O1

void __thiscall xray_re::xr_visual_object::~xr_visual_object(xr_visual_object *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_xr_custom_object)._vptr_xr_custom_object =
       (_func_int **)&PTR__xr_visual_object_0024a088;
  pcVar2 = (this->m_reference)._M_dataplus._M_p;
  paVar1 = &(this->m_reference).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  xr_custom_object::~xr_custom_object(&this->super_xr_custom_object);
  return;
}

Assistant:

xr_visual_object::~xr_visual_object() {}